

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int xmlBufGrow(xmlBufPtr buf,int len)

{
  xmlBufferAllocationScheme xVar1;
  ulong uVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *extra;
  long lVar9;
  
  uVar8 = 0xffffffffffffffff;
  if (len < 0 || buf == (xmlBufPtr)0x0) goto LAB_001366de;
  if (len == 0) {
    uVar8 = 0;
    goto LAB_001366de;
  }
  if (buf->error != 0) goto LAB_001366de;
  uVar4 = (ulong)buf->compat_size;
  uVar2 = buf->size;
  if (buf->size != uVar4 && uVar4 < 0x7fffffff) {
    buf->size = uVar4;
    uVar2 = uVar4;
  }
  uVar6 = (ulong)buf->compat_use;
  uVar4 = buf->use;
  if (buf->use != uVar6 && uVar6 < 0x7fffffff) {
    buf->use = uVar6;
    uVar4 = uVar6;
  }
  xVar1 = buf->alloc;
  if (xVar1 == XML_BUFFER_ALLOC_IMMUTABLE) {
LAB_001366c9:
    uVar7 = 0;
  }
  else {
    uVar6 = (ulong)(uint)len;
    if (uVar6 < uVar2 - uVar4) {
      uVar7 = (uVar2 - uVar4) - 1;
    }
    else {
      if (~uVar4 <= uVar6) {
        extra = "growing buffer past SIZE_MAX";
LAB_001366c1:
        xmlBufMemoryError(buf,extra);
        goto LAB_001366c9;
      }
      if (uVar6 < uVar2) {
        uVar7 = 0xffffffffffffffff;
        if (-1 < (long)uVar2) {
          uVar7 = uVar2 * 2;
        }
      }
      else {
        uVar7 = 0xffffffffffffffff;
        if (uVar4 + uVar6 < 0xffffffffffffff9c) {
          uVar7 = uVar4 + uVar6 + 100;
        }
      }
      if (xVar1 == XML_BUFFER_ALLOC_IO) {
        pxVar3 = buf->contentIO;
        if (pxVar3 == (xmlChar *)0x0) goto LAB_00136667;
        lVar9 = (long)buf->content - (long)pxVar3;
        pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar3,lVar9 + uVar7);
        if (pxVar3 == (xmlChar *)0x0) goto LAB_001366b1;
        buf->contentIO = pxVar3;
        pxVar3 = pxVar3 + lVar9;
      }
      else {
        if (xVar1 == XML_BUFFER_ALLOC_BOUNDED) {
          if ((9999999 < uVar2) || ((uVar6 + uVar4) - 9999999 < 0xffffffffff676980)) {
            extra = "buffer error: text too long\n";
            goto LAB_001366c1;
          }
          if (9999999 < uVar7) {
            uVar7 = 10000000;
          }
        }
LAB_00136667:
        pxVar3 = (xmlChar *)(*xmlRealloc)(buf->content,uVar7);
        if (pxVar3 == (xmlChar *)0x0) {
LAB_001366b1:
          extra = "growing buffer";
          goto LAB_001366c1;
        }
      }
      buf->content = pxVar3;
      buf->size = uVar7;
      uVar5 = 0x7fffffff;
      if (uVar7 < 0x7fffffff) {
        uVar5 = (uint)uVar7;
      }
      buf->compat_size = uVar5;
      uVar2 = buf->use;
      uVar4 = 0x7fffffff;
      if (uVar2 < 0x7fffffff) {
        uVar4 = uVar2;
      }
      buf->compat_use = (uint)uVar4;
      uVar7 = ~uVar2 + uVar7;
    }
  }
  if ((buf->error == 0) && (uVar8 = 0x7fffffff, uVar7 < 0x7fffffff)) {
    uVar8 = uVar7;
  }
LAB_001366de:
  return (int)uVar8;
}

Assistant:

int
xmlBufGrow(xmlBufPtr buf, int len) {
    size_t ret;

    if ((buf == NULL) || (len < 0)) return(-1);
    if (len == 0)
        return(0);
    ret = xmlBufGrowInternal(buf, len);
    if (buf->error != 0)
        return(-1);
    return(ret > INT_MAX ? INT_MAX : ret);
}